

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

void __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
render(basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,render_handler *handler,
      context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *ctx,bool root_renderer)

{
  anon_class_24_3_6f1512f8 local_60;
  walk_callback local_48;
  byte local_21;
  context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pcStack_20;
  bool root_renderer_local;
  context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ctx_local;
  render_handler *handler_local;
  basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_60.handler = handler;
  local_60.ctx = ctx;
  local_60.this = this;
  local_21 = root_renderer;
  pcStack_20 = ctx;
  ctx_local = (context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)handler;
  handler_local = (render_handler *)this;
  std::
  function<kainjow::mustache::component<std::__cxx11::string>::walk_control(kainjow::mustache::component<std::__cxx11::string>&)>
  ::
  function<kainjow::mustache::basic_mustache<std::__cxx11::string>::render(std::function<void(std::__cxx11::string_const&)>const&,kainjow::mustache::context_internal<std::__cxx11::string>&,bool)::_lambda(kainjow::mustache::component<std::__cxx11::string>&)_1_,void>
            ((function<kainjow::mustache::component<std::__cxx11::string>::walk_control(kainjow::mustache::component<std::__cxx11::string>&)>
              *)&local_48,&local_60);
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  walk_children(&this->root_component_,&local_48);
  Catch::clara::std::
  function<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::walk_control_(kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
  ::~function(&local_48);
  if ((local_21 & 1) != 0) {
    render_current_line(this,(render_handler *)ctx_local,pcStack_20,
                        (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x0);
  }
  return;
}

Assistant:

void render(const render_handler& handler, context_internal<string_type>& ctx, bool root_renderer = true) {
        root_component_.walk_children([&handler, &ctx, this](component<string_type>& comp) -> typename component<string_type>::walk_control {
            return render_component(handler, ctx, comp);
        });
        // process the last line, but only for the top-level renderer
        if (root_renderer) {
            render_current_line(handler, ctx, nullptr);
        }
    }